

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetColumnOffset(int column_index,float offset)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *window_00;
  value_type *pvVar3;
  float fVar4;
  float local_38;
  ImGuiID column_id;
  float offset_norm;
  float width;
  bool preserve_width;
  ImGuiWindow *window;
  ImGuiContext *g;
  float offset_local;
  int column_index_local;
  
  pIVar2 = GImGui;
  window_00 = GetCurrentWindow();
  g._4_4_ = column_index;
  if (column_index < 0) {
    g._4_4_ = (window_00->DC).ColumnsCurrent;
  }
  if (g._4_4_ < (window_00->DC).ColumnsData.Size) {
    bVar1 = false;
    if (((window_00->DC).ColumnsFlags & 4U) == 0) {
      bVar1 = g._4_4_ < (window_00->DC).ColumnsCount + -1;
    }
    if (bVar1) {
      local_38 = GetColumnWidth(g._4_4_);
    }
    else {
      local_38 = 0.0;
    }
    g._0_4_ = offset;
    if (((window_00->DC).ColumnsFlags & 8U) == 0) {
      g._0_4_ = ImMin(offset,-(pIVar2->Style).ColumnsMinSpacing *
                             (float)((window_00->DC).ColumnsCount - g._4_4_) +
                             (window_00->DC).ColumnsMaxX);
    }
    fVar4 = PixelsToOffsetNorm(window_00,g._0_4_);
    ImGuiStorage::SetFloat
              ((window_00->DC).StateStorage,(window_00->DC).ColumnsSetId + g._4_4_,fVar4);
    pvVar3 = ImVector<ImGuiColumnData>::operator[](&(window_00->DC).ColumnsData,g._4_4_);
    pvVar3->OffsetNorm = fVar4;
    if (bVar1) {
      fVar4 = ImMax((pIVar2->Style).ColumnsMinSpacing,local_38);
      SetColumnOffset(g._4_4_ + 1,g._0_4_ + fVar4);
    }
    return;
  }
  __assert_fail("column_index < window->DC.ColumnsData.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                ,0x277b,"void ImGui::SetColumnOffset(int, float)");
}

Assistant:

void ImGui::SetColumnOffset(int column_index, float offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (column_index < 0)
        column_index = window->DC.ColumnsCurrent;

    IM_ASSERT(column_index < window->DC.ColumnsData.Size);

    const bool preserve_width = !(window->DC.ColumnsFlags & ImGuiColumnsFlags_NoPreserveWidths) && (column_index < window->DC.ColumnsCount-1);
    const float width = preserve_width ? GetColumnWidth(column_index) : 0.0f;

    if (!(window->DC.ColumnsFlags & ImGuiColumnsFlags_NoForceWithinWindow))
        offset = ImMin(offset, window->DC.ColumnsMaxX - g.Style.ColumnsMinSpacing * (window->DC.ColumnsCount - column_index));
    const float offset_norm = PixelsToOffsetNorm(window, offset);

    const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(column_index);
    window->DC.StateStorage->SetFloat(column_id, offset_norm);
    window->DC.ColumnsData[column_index].OffsetNorm = offset_norm;

    if (preserve_width)
        SetColumnOffset(column_index + 1, offset + ImMax(g.Style.ColumnsMinSpacing, width));
}